

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_mp3_get_mp3_and_pcm_frame_count
                    (ma_dr_mp3 *pMP3,ma_uint64 *pMP3FrameCount,ma_uint64 *pPCMFrameCount)

{
  ma_uint64 frameIndex;
  long lVar1;
  ma_bool32 mVar2;
  ma_uint32 mVar3;
  long lVar4;
  ma_uint64 mVar5;
  ma_bool32 mVar6;
  
  mVar6 = 0;
  if ((pMP3 != (ma_dr_mp3 *)0x0) && (pMP3->onSeek != (ma_dr_mp3_seek_proc)0x0)) {
    frameIndex = pMP3->currentPCMFrame;
    mVar6 = 0;
    mVar2 = (*pMP3->onSeek)(pMP3->pUserData,0,ma_dr_mp3_seek_origin_start);
    if (mVar2 != 0) {
      mVar5 = 0;
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = 0;
      pMP3->dataSize = 0;
      pMP3->currentPCMFrame = 0;
      pMP3->streamCursor = 0;
      pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
      (pMP3->decoder).header[0] = '\0';
      lVar1 = -1;
      do {
        lVar4 = lVar1;
        mVar3 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)0x0);
        mVar5 = mVar5 + mVar3;
        lVar1 = lVar4 + 1;
      } while (mVar3 != 0);
      mVar6 = 0;
      mVar2 = (*pMP3->onSeek)(pMP3->pUserData,0,ma_dr_mp3_seek_origin_start);
      if (mVar2 != 0) {
        mVar6 = 0;
        pMP3->pcmFramesConsumedInMP3Frame = 0;
        pMP3->pcmFramesRemainingInMP3Frame = 0;
        pMP3->dataSize = 0;
        pMP3->currentPCMFrame = 0;
        pMP3->streamCursor = 0;
        pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
        (pMP3->decoder).header[0] = '\0';
        mVar2 = ma_dr_mp3_seek_to_pcm_frame(pMP3,frameIndex);
        if (mVar2 != 0) {
          if (pMP3FrameCount != (ma_uint64 *)0x0) {
            *pMP3FrameCount = lVar4 + 1;
          }
          mVar6 = 1;
          if (pPCMFrameCount != (ma_uint64 *)0x0) {
            *pPCMFrameCount = mVar5;
          }
        }
      }
    }
  }
  return mVar6;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_get_mp3_and_pcm_frame_count(ma_dr_mp3* pMP3, ma_uint64* pMP3FrameCount, ma_uint64* pPCMFrameCount)
{
    ma_uint64 currentPCMFrame;
    ma_uint64 totalPCMFrameCount;
    ma_uint64 totalMP3FrameCount;
    if (pMP3 == NULL) {
        return MA_FALSE;
    }
    if (pMP3->onSeek == NULL) {
        return MA_FALSE;
    }
    currentPCMFrame = pMP3->currentPCMFrame;
    if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
        return MA_FALSE;
    }
    totalPCMFrameCount = 0;
    totalMP3FrameCount = 0;
    for (;;) {
        ma_uint32 pcmFramesInCurrentMP3Frame;
        pcmFramesInCurrentMP3Frame = ma_dr_mp3_decode_next_frame_ex(pMP3, NULL);
        if (pcmFramesInCurrentMP3Frame == 0) {
            break;
        }
        totalPCMFrameCount += pcmFramesInCurrentMP3Frame;
        totalMP3FrameCount += 1;
    }
    if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
        return MA_FALSE;
    }
    if (!ma_dr_mp3_seek_to_pcm_frame(pMP3, currentPCMFrame)) {
        return MA_FALSE;
    }
    if (pMP3FrameCount != NULL) {
        *pMP3FrameCount = totalMP3FrameCount;
    }
    if (pPCMFrameCount != NULL) {
        *pPCMFrameCount = totalPCMFrameCount;
    }
    return MA_TRUE;
}